

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_c.h
# Opt level: O0

void __thiscall
dlib::
queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::dequeue(queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
          *this,T *item)

{
  long lVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  undefined8 uVar4;
  long *in_RDI;
  ostringstream dlib_o_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  error_type t;
  queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_fffffffffffffde0;
  ostream local_188;
  
  lVar1 = (**(code **)(*in_RDI + 0x40))();
  if (lVar1 == 0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    poVar2 = std::operator<<(&local_188,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x49);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../queue/queue_kernel_c.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::queue_kernel_c<dlib::queue_kernel_1<std::basic_string<char>>>::dequeue(T &) [queue_base = dlib::queue_kernel_1<std::basic_string<char>>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_188,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"this->size() != 0");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_188,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"\tvoid queue::dequeue");
    poVar3 = std::operator<<(poVar2,"\n\tsize of queue should not be zero");
    a = (string *)std::operator<<(poVar3,"\n\tthis: ");
    t = (error_type)((ulong)poVar3 >> 0x20);
    poVar3 = (ostream *)std::ostream::operator<<(a,in_RDI);
    std::operator<<(poVar3,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::dequeue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  return;
}

Assistant:

void queue_kernel_c<queue_base>::
    dequeue (
        T& item
    )
    {

        // make sure requires clause is not broken
        DLIB_CASSERT(this->size() != 0,
            "\tvoid queue::dequeue"
            << "\n\tsize of queue should not be zero"
            << "\n\tthis: " << this
            );

        // call the real function
        queue_base::dequeue(item);

    }